

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O2

bool __thiscall
PressDelayHandler::released
          (PressDelayHandler *this,QEvent *e,bool scrollerWasActive,bool scrollerIsActive)

{
  bool bVar1;
  bool bVar2;
  QMouseEvent *me;
  QMouseEvent *oldD;
  
  if ((this->pressDelayTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  if ((this->pressDelayEvent).d != (QMouseEvent *)0x0) {
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->mouseTarget);
    if (bVar1 && !scrollerIsActive) {
      me = copyMouseEvent(e);
      sendMouseEvent(this,(this->pressDelayEvent).d,1);
      sendMouseEvent(this,me,0);
      bVar1 = true;
      if (me != (QMouseEvent *)0x0) {
        (**(code **)(*(long *)me + 8))(me);
      }
      goto LAB_005d96b1;
    }
  }
  bVar1 = scrollerWasActive || scrollerIsActive;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->mouseTarget);
  if (bVar2 && scrollerIsActive) {
    sendMouseEvent(this,(QMouseEvent *)0x0,1);
  }
LAB_005d96b1:
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::reset
            (&this->pressDelayEvent,(QMouseEvent *)0x0);
  QWeakPointer<QObject>::assign<QObject>(&(this->mouseTarget).wp,(QObject *)0x0);
  return bVar1;
}

Assistant:

bool released(QEvent *e, bool scrollerWasActive, bool scrollerIsActive)
    {
        // consume this event if the scroller was or is active
        bool result = scrollerWasActive || scrollerIsActive;

        // stop the timer
        if (pressDelayTimer.isActive())
            pressDelayTimer.stop();

        // we still haven't even sent the press, so do it now
        if (pressDelayEvent && mouseTarget && !scrollerIsActive) {
            QScopedPointer<QMouseEvent> releaseEvent(copyMouseEvent(e));

            qFGDebug() << "QFG: re-sending mouse press (due to release) for " << mouseTarget;
            sendMouseEvent(pressDelayEvent.data(), UngrabMouseBefore);

            qFGDebug() << "QFG: faking mouse release (due to release) for " << mouseTarget;
            sendMouseEvent(releaseEvent.data());

            result = true; // consume this event
        } else if (mouseTarget && scrollerIsActive) {
            // we grabbed the mouse explicitly when the scroller became active, so undo that now
            sendMouseEvent(nullptr, UngrabMouseBefore);
        }
        pressDelayEvent.reset(nullptr);
        mouseTarget = nullptr;
        return result;
    }